

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void formatter_suite::format_string(void)

{
  pointer *this;
  iterator iVar1;
  iterator iVar2;
  basic_variable<std::allocator<char>_> *data_00;
  basic_variable<std::allocator<char>_> *data_01;
  basic_variable<std::allocator<char>_> *data_02;
  basic_variable<std::allocator<char>_> *data_03;
  error *ex_2;
  undefined1 local_1b8 [8];
  variable data_3;
  error *ex_1;
  undefined1 local_138 [8];
  variable data_2;
  error *ex;
  undefined1 local_b8 [8];
  variable data_1;
  undefined4 local_64;
  undefined1 local_60;
  undefined1 local_5f [3];
  value_type expected [5];
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  variable data;
  
  this = &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)this,"ABC");
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,(bintoken *)this,
             data_00);
  local_60 = 0x43;
  local_64 = 0x424103a9;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0xfe,"void formatter_suite::format_string()",iVar1._M_current,iVar2._M_current,
             &local_64,local_5f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b8,L"ABC");
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ex,(bintoken *)local_b8,
             data_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ex);
  trial::protocol::core::detail::throw_failed_impl
            ("bintoken::format<buffer_type>(data)","bintoken::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x104,"void formatter_suite::format_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138,L"ABC");
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ex_1,(bintoken *)local_138,
             data_02);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ex_1);
  trial::protocol::core::detail::throw_failed_impl
            ("bintoken::format<buffer_type>(data)","bintoken::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x10a,"void formatter_suite::format_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1b8,L"ABC");
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ex_2,(bintoken *)local_1b8,
             data_03);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ex_2);
  trial::protocol::core::detail::throw_failed_impl
            ("bintoken::format<buffer_type>(data)","bintoken::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x110,"void formatter_suite::format_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1b8);
  return;
}

Assistant:

void format_string()
{
    {
        variable data("ABC");
        auto result = bintoken::format<buffer_type>(data);
        const value_type expected[] = { bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43 };
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected, expected + sizeof(expected),
                                     std::equal_to<value_type>());
    }
    {
        variable data(L"ABC");
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(bintoken::format<buffer_type>(data),
                                        bintoken::error,
                                        "incompatible type");
    }
    {
        variable data(u"ABC");
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(bintoken::format<buffer_type>(data),
                                        bintoken::error,
                                        "incompatible type");
    }
    {
        variable data(U"ABC");
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(bintoken::format<buffer_type>(data),
                                        bintoken::error,
                                        "incompatible type");
    }
}